

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void __thiscall cashew::JSPrinter::printUnaryPrefix(JSPrinter *this,Ref node)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  Ref *pRVar4;
  ulong uVar5;
  char *pcVar6;
  Value *pVVar7;
  char *pcVar8;
  undefined8 *puVar9;
  char *local_40;
  char *end;
  char *e;
  char *curr;
  int last;
  JSPrinter *this_local;
  Ref node_local;
  
  this_local = (JSPrinter *)node.inst;
  if ((this->finalize & 1U) != 0) {
    pRVar4 = (Ref *)cashew::Ref::operator[]((uint)&this_local);
    uVar5 = cashew::Ref::operator==(pRVar4,(IString *)&PLUS);
    if ((uVar5 & 1) != 0) {
      pRVar4 = (Ref *)cashew::Ref::operator[]((uint)&this_local);
      pVVar7 = Ref::operator->(pRVar4);
      bVar1 = Value::isNumber(pVVar7);
      if (bVar1) {
LAB_0026bc9c:
        iVar3 = (int)this->used;
        puVar9 = (undefined8 *)cashew::Ref::operator[]((uint)&this_local);
        print(this,(Value *)*puVar9);
        ensure(this,1);
        pcVar8 = this->buffer + iVar3;
        this->buffer[this->used] = '\0';
        pcVar6 = strstr(pcVar8,"Infinity");
        if (pcVar6 != (char *)0x0) {
          return;
        }
        pcVar6 = strstr(pcVar8,"NaN");
        if (pcVar6 != (char *)0x0) {
          return;
        }
        pcVar6 = strchr(pcVar8,0x2e);
        if (pcVar6 != (char *)0x0) {
          return;
        }
        pcVar8 = strchr(pcVar8,0x65);
        if (pcVar8 == (char *)0x0) {
          emit(this,".0");
          return;
        }
        ensure(this,3);
        for (local_40 = strchr(this->buffer + iVar3,0); pcVar8 <= local_40; local_40 = local_40 + -1
            ) {
          local_40[2] = *local_40;
        }
        *pcVar8 = '.';
        pcVar8[1] = '0';
        this->used = this->used + 2;
        return;
      }
      pRVar4 = (Ref *)cashew::Ref::operator[]((uint)&this_local);
      pVVar7 = Ref::operator->(pRVar4);
      bVar1 = Value::isArray(pVVar7);
      if (bVar1) {
        uVar2 = cashew::Ref::operator[]((uint)&this_local);
        pRVar4 = (Ref *)cashew::Ref::operator[](uVar2);
        uVar5 = cashew::Ref::operator==(pRVar4,(IString *)&UNARY_PREFIX);
        if ((uVar5 & 1) != 0) {
          uVar2 = cashew::Ref::operator[]((uint)&this_local);
          pRVar4 = (Ref *)cashew::Ref::operator[](uVar2);
          uVar5 = cashew::Ref::operator==(pRVar4,(IString *)&MINUS);
          if ((uVar5 & 1) != 0) {
            uVar2 = cashew::Ref::operator[]((uint)&this_local);
            pRVar4 = (Ref *)cashew::Ref::operator[](uVar2);
            pVVar7 = Ref::operator->(pRVar4);
            bVar1 = Value::isNumber(pVVar7);
            if (bVar1) goto LAB_0026bc9c;
          }
        }
      }
    }
  }
  if (this->buffer[this->used - 1] == '-') {
    pRVar4 = (Ref *)cashew::Ref::operator[]((uint)&this_local);
    uVar5 = cashew::Ref::operator==(pRVar4,(IString *)&MINUS);
    if ((uVar5 & 1) == 0) goto LAB_0026be26;
  }
  else {
LAB_0026be26:
    if (this->buffer[this->used - 1] != '+') goto LAB_0026be70;
    pRVar4 = (Ref *)cashew::Ref::operator[]((uint)&this_local);
    uVar5 = cashew::Ref::operator==(pRVar4,(IString *)&PLUS);
    if ((uVar5 & 1) == 0) goto LAB_0026be70;
  }
  emit(this,' ');
LAB_0026be70:
  pRVar4 = (Ref *)cashew::Ref::operator[]((uint)&this_local);
  pVVar7 = Ref::operator->(pRVar4);
  pcVar8 = Value::getCString(pVVar7);
  emit(this,pcVar8);
  puVar9 = (undefined8 *)cashew::Ref::operator[]((uint)&this_local);
  printChild(this,(Value *)*puVar9,(Ref)this_local,1);
  return;
}

Assistant:

void printUnaryPrefix(Ref node) {
    if (finalize && node[1] == PLUS &&
        (node[2]->isNumber() ||
         (node[2]->isArray() && node[2][0] == UNARY_PREFIX &&
          node[2][1] == MINUS && node[2][2]->isNumber()))) {
      // emit a finalized number
      int last = used;
      print(node[2]);
      ensure(1);                  // we temporarily append a 0
      char* curr = buffer + last; // ensure might invalidate
      buffer[used] = 0;
      if (strstr(curr, "Infinity")) {
        return;
      }
      if (strstr(curr, "NaN")) {
        return;
      }
      if (strchr(curr, '.')) {
        return; // already a decimal point, all good
      }
      char* e = strchr(curr, 'e');
      if (!e) {
        emit(".0");
        return;
      }
      ensure(3);
      curr = buffer + last; // ensure might invalidate
      char* end = strchr(curr, 0);
      while (end >= e) {
        end[2] = end[0];
        end--;
      }
      e[0] = '.';
      e[1] = '0';
      used += 2;
      return;
    }
    if ((buffer[used - 1] == '-' && node[1] == MINUS) ||
        (buffer[used - 1] == '+' && node[1] == PLUS)) {
      emit(' '); // cannot join - and - to --, looks like the -- operator
    }
    emit(node[1]->getCString());
    printChild(node[2], node, 1);
  }